

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall CLayer::CreateBoundary(CLayer *this)

{
  int iVar1;
  CDesign *pCVar2;
  CBoundary *this_00;
  longlong lVar3;
  bool bVar4;
  int local_18;
  int local_14;
  int j;
  int i;
  CLayer *this_local;
  
  iVar1 = IsHorizontal(this);
  bVar4 = true;
  if (iVar1 == 0) {
    iVar1 = IsVertical(this);
    bVar4 = iVar1 != 0;
  }
  if (!bVar4) {
    __assert_fail("IsHorizontal()||IsVertical()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                  ,0xb1,"void CLayer::CreateBoundary()");
  }
  iVar1 = IsHorizontal(this);
  if (iVar1 == 0) {
    pCVar2 = CObject::GetDesign();
    iVar1 = CBBox::W(&pCVar2->super_CBBox);
    this->m_iMaxBX = iVar1;
    pCVar2 = CObject::GetDesign();
    iVar1 = CBBox::H(&pCVar2->super_CBBox);
    this->m_iMaxBY = iVar1 + -1;
  }
  else {
    pCVar2 = CObject::GetDesign();
    iVar1 = CBBox::W(&pCVar2->super_CBBox);
    this->m_iMaxBX = iVar1 + -1;
    pCVar2 = CObject::GetDesign();
    iVar1 = CBBox::H(&pCVar2->super_CBBox);
    this->m_iMaxBY = iVar1;
  }
  for (local_14 = 0; local_14 < this->m_iMaxBX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < this->m_iMaxBY; local_18 = local_18 + 1) {
      this_00 = GetBoundary(this,local_14,local_18);
      lVar3 = CObject::GetKey(&this->super_CObject);
      CBoundary::Initialize(this_00,local_14,local_18,(int)lVar3,this);
    }
  }
  return;
}

Assistant:

void CLayer::CreateBoundary()
{ 
	assert(IsHorizontal()||IsVertical());

	// different size of boundary array by direction [6/22/2006 thyeros]
	if(IsHorizontal())	
	{
		m_iMaxBX	=	GetDesign()->W()-1;
		m_iMaxBY	=	GetDesign()->H();
	}
	else		
	{
		m_iMaxBX	=	GetDesign()->W();
		m_iMaxBY	=	GetDesign()->H()-1;
	}

	for (int i=0;i<m_iMaxBX;++i)
		for (int j=0;j<m_iMaxBY;++j)
			GetBoundary(i,j)->CBoundary::Initialize(i,j,GetKey(),this);
}